

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O3

void __thiscall
eos::render::Rasterizer<eos::render::ExtractionFragmentShader>::raster_triangle<double>
          (Rasterizer<eos::render::ExtractionFragmentShader> *this,Vertex<double> *point_a,
          Vertex<double> *point_b,Vertex<double> *point_c,optional<eos::render::Texture> *texture)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  int *piVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  Image<eos::core::Pixel<unsigned_char,_4>_> *this_00;
  double *pdVar10;
  Pixel<unsigned_char,_4> *pPVar11;
  int pixel_index_col;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float dudx;
  float fVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  double dVar32;
  float fVar33;
  double dVar34;
  float fVar35;
  Rect<int> RVar36;
  ulong local_1f0;
  plane gamma_plane;
  plane beta_plane;
  plane alpha_plane;
  Vector3<double> local_158;
  Vector4<double> local_138;
  Vector3<double> local_118;
  ulong local_100;
  Image<eos::core::Pixel<unsigned_char,_4>_> *local_f8;
  Vertex<double> *local_f0;
  Vertex<double> *local_e8;
  optional<eos::render::Texture> *local_e0;
  double local_d8;
  undefined8 uStack_d0;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  RVar36 = detail::calculate_clipped_bounding_box<double>
                     ((Vector2<double> *)&local_138,(Vector2<double> *)&local_158,
                      (Vector2<double> *)&local_118,this->viewport_width,this->viewport_height);
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<double>(&alpha_plane,(Vector3<double> *)&local_138,&local_158,&local_118);
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<double>(&beta_plane,(Vector3<double> *)&local_138,&local_158,&local_118);
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = *(undefined1 (*) [16])
            (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  detail::plane::plane<double>(&gamma_plane,(Vector3<double> *)&local_138,&local_158,&local_118);
  if (-1 < RVar36._8_8_) {
    fVar20 = 1.0 / alpha_plane.c;
    fVar24 = 1.0 / beta_plane.c;
    fVar17 = 1.0 / gamma_plane.c;
    local_78 = -alpha_plane.a * fVar20;
    uStack_74 = 0x80000000;
    uStack_70 = 0x80000000;
    uStack_6c = 0x80000000;
    local_98 = -beta_plane.a * fVar24;
    uStack_94 = 0x80000000;
    uStack_90 = 0x80000000;
    uStack_8c = 0x80000000;
    local_b8 = -gamma_plane.a * fVar17;
    uStack_b4 = 0x80000000;
    uStack_b0 = 0x80000000;
    uStack_ac = 0x80000000;
    local_88 = -alpha_plane.b * fVar20;
    uStack_84 = 0x80000000;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    local_a8 = -beta_plane.b * fVar24;
    uStack_a4 = 0x80000000;
    uStack_a0 = 0x80000000;
    uStack_9c = 0x80000000;
    local_c8 = -gamma_plane.b * fVar17;
    uStack_c4 = 0x80000000;
    uStack_c0 = 0x80000000;
    uStack_bc = 0x80000000;
    local_1f0 = RVar36._0_8_ >> 0x20;
    uVar14 = RVar36.height + RVar36.y;
    iVar12 = RVar36.x;
    iVar15 = iVar12 + RVar36.width;
    if (iVar15 <= iVar12) {
      iVar15 = iVar12;
    }
    local_f8 = &this->colorbuffer;
    local_100 = (ulong)uVar14;
    if ((int)uVar14 <= RVar36.y) {
      local_100 = local_1f0;
    }
    local_f0 = point_b;
    local_e8 = point_c;
    local_e0 = texture;
    do {
      if (-1 < RVar36.width) {
        fVar18 = (float)(int)local_1f0 + 0.5;
        dVar21 = (double)fVar18;
        local_48._8_4_ = SUB84(dVar21,0);
        local_48._0_8_ = dVar21;
        local_48._12_4_ = (int)((ulong)dVar21 >> 0x20);
        uVar13 = RVar36._0_8_ & 0xffffffff;
        uStack_d0 = 0;
        local_d8 = dVar21;
        do {
          iVar12 = (int)uVar13;
          fVar35 = (float)iVar12 + 0.5;
          dVar22 = (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0];
          dVar1 = (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[1];
          dVar2 = (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[0];
          dVar3 = (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[1];
          auVar23 = *(undefined1 (*) [16])
                     (point_c->position).
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array;
          dVar4 = auVar23._0_8_;
          dVar34 = auVar23._8_8_;
          dVar8 = (double)fVar35;
          dVar32 = ((dVar1 - dVar3) * dVar8 + (dVar2 - dVar22) * dVar21 + dVar22 * dVar3 +
                   -dVar2 * dVar1) *
                   (1.0 / ((double)(float)dVar4 * (dVar1 - dVar3) +
                           (double)(float)dVar34 * (dVar2 - dVar22) + dVar22 * dVar3 +
                          -dVar2 * dVar1));
          if (0.0 <= dVar32) {
            dVar7 = (double)(float)dVar2 * (dVar34 - dVar1) +
                    (double)(float)dVar3 * (dVar22 - dVar4) + dVar1 * dVar4 + -dVar22 * dVar34;
            auVar23._8_4_ = SUB84(dVar7,0);
            auVar23._0_8_ =
                 (double)(float)dVar22 * (dVar3 - dVar34) + (double)(float)dVar1 * (dVar4 - dVar2) +
                 dVar2 * dVar34 + -dVar4 * dVar3;
            auVar23._12_4_ = (int)((ulong)dVar7 >> 0x20);
            auVar23 = divpd(_DAT_0018f1d0,auVar23);
            dVar2 = (dVar8 * (dVar3 - dVar34) + (dVar4 - dVar2) * (double)local_48._0_8_ +
                     dVar2 * dVar34 + -dVar4 * dVar3) * auVar23._0_8_;
            dVar22 = (dVar8 * (dVar34 - dVar1) + (dVar22 - dVar4) * (double)local_48._8_8_ +
                      dVar1 * dVar4 + -dVar22 * dVar34) * auVar23._8_8_;
            uVar25 = (undefined4)((ulong)dVar22 >> 0x20);
            if ((0.0 <= dVar2) && (0.0 <= dVar22)) {
              dVar1 = (point_c->position).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[2] * dVar32 +
                      (point_a->position).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[2] * dVar2 +
                      (point_b->position).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[2] * dVar22;
              cVar5 = this->enable_depth_test;
              dVar3 = dVar22;
              if ((bool)cVar5 == true) {
                bVar16 = this->enable_far_clipping;
                local_58._8_4_ = SUB84(dVar22,0);
                local_58._0_8_ = dVar2;
                local_58._12_4_ = uVar25;
                local_68._8_4_ = SUB84(dVar22,0);
                local_68._0_8_ = dVar22;
                local_68._12_4_ = uVar25;
                pdVar10 = core::Image<double>::operator()(&this->depthbuffer,(int)local_1f0,iVar12);
                dVar2 = (double)local_58._0_8_;
                dVar3 = (double)local_58._8_8_;
                dVar22 = (double)local_68._0_8_;
                if ((byte)(*pdVar10 <= dVar1 | 1.0 < dVar1 & bVar16) == 1) {
                  cVar5 = this->enable_depth_test;
                  dVar21 = local_d8;
                  goto joined_r0x00184e6c;
                }
              }
              else {
joined_r0x00184e6c:
                if (cVar5 != '\0') goto LAB_001851ab;
              }
              if (this->perspective_correct_barycentric_weights == true) {
                dVar21 = (point_a->position).
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[3];
                dVar4 = (point_b->position).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[3];
                dVar8 = (point_c->position).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[3];
                dVar22 = 1.0 / (dVar32 * dVar8 + dVar2 * dVar21 + dVar22 * dVar4);
                dVar2 = dVar2 * dVar22 * dVar21;
                dVar3 = dVar3 * dVar22 * dVar4;
                dVar32 = dVar32 * dVar8 * dVar22;
              }
              local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1]._0_4_ = SUB84(dVar3,0);
              local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = dVar2;
              local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1]._4_4_ = (int)((ulong)dVar3 >> 0x20);
              if ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
                  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                  super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
                fVar19 = -(gamma_plane.a * fVar35 + gamma_plane.b * fVar18 + gamma_plane.d) * fVar17
                ;
                fVar29 = (beta_plane.a * fVar35 + beta_plane.b * fVar18 + beta_plane.d) * fVar24;
                fVar9 = 1.0 / (fVar19 * fVar19);
                fVar33 = (alpha_plane.a * fVar35 + alpha_plane.b * fVar18 + alpha_plane.d) * fVar20;
                piVar6 = *(int **)&(texture->
                                   super__Optional_base<eos::render::Texture,_false,_false>).
                                   _M_payload.
                                   super__Optional_payload<eos::render::Texture,_true,_false,_false>
                                   .super__Optional_payload_base<eos::render::Texture>._M_payload.
                                   _M_value.mipmaps.
                                   super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                ;
                fVar30 = (float)piVar6[1];
                dudx = (fVar19 * local_78 + fVar33 * local_b8) * fVar9 * fVar30;
                fVar30 = (local_98 * fVar19 + fVar29 * local_b8) * fVar9 * fVar30;
                fVar31 = (float)*piVar6;
                fVar33 = (local_88 * fVar19 + local_c8 * fVar33) * fVar9 * fVar31;
                fVar31 = (local_a8 * fVar19 + local_c8 * fVar29) * fVar9 * fVar31;
              }
              else {
                dudx = 0.0;
                fVar30 = 0.0;
                fVar33 = 0.0;
                fVar31 = 0.0;
              }
              local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = dVar32;
              ExtractionFragmentShader::shade_triangle_pixel<double>
                        (&local_138,(ExtractionFragmentShader *)this,(int)fVar35,(int)fVar18,point_a
                         ,point_b,point_c,&local_158,texture,dudx,fVar30,fVar33,fVar31);
              this_00 = local_f8;
              uVar26 = 0;
              uVar28 = 0x3ff00000;
              uVar25 = uVar26;
              uVar27 = uVar28;
              if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[0] <= 1.0) {
                uVar25 = SUB84(local_138.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[0],0);
                uVar27 = (undefined4)
                         ((ulong)local_138.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[0] >> 0x20);
              }
              if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[1] <= 1.0) {
                uVar26 = SUB84(local_138.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[1],0);
                uVar28 = (undefined4)
                         ((ulong)local_138.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[1] >> 0x20);
              }
              dVar21 = 1.0;
              if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[2] <= 1.0) {
                dVar21 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[2];
              }
              dVar22 = 1.0;
              if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[3] <= 1.0) {
                dVar22 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[3];
              }
              pPVar11 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (local_f8,(int)local_1f0,iVar12);
              (pPVar11->data_)._M_elems[0] = (uchar)(int)(dVar21 * 255.0);
              pPVar11 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (this_00,(int)local_1f0,iVar12);
              (pPVar11->data_)._M_elems[1] = (uchar)(int)((double)CONCAT44(uVar28,uVar26) * 255.0);
              pPVar11 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (this_00,(int)local_1f0,iVar12);
              (pPVar11->data_)._M_elems[2] = (uchar)(int)((double)CONCAT44(uVar27,uVar25) * 255.0);
              pPVar11 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (this_00,(int)local_1f0,iVar12);
              (pPVar11->data_)._M_elems[3] = (uchar)(int)(dVar22 * 255.0);
              point_b = local_f0;
              texture = local_e0;
              point_c = local_e8;
              dVar21 = local_d8;
              if (this->enable_depth_test == true) {
                pdVar10 = core::Image<double>::operator()(&this->depthbuffer,(int)local_1f0,iVar12);
                *pdVar10 = dVar1;
                point_b = local_f0;
                texture = local_e0;
                point_c = local_e8;
                dVar21 = local_d8;
              }
            }
          }
LAB_001851ab:
          uVar13 = (ulong)(iVar12 + 1U);
        } while (iVar15 + 1U != iVar12 + 1U);
      }
      bVar16 = (int)local_1f0 != (int)local_100;
      local_1f0 = (ulong)((int)local_1f0 + 1);
    } while (bVar16);
  }
  return;
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }